

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

void __thiscall
iutest::detail::NotMatcher<iutest::detail::EqMatcher<int>_>::~NotMatcher
          (NotMatcher<iutest::detail::EqMatcher<int>_> *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

class NotMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit NotMatcher(const T& unexpected) : m_unexpected(unexpected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( !CastToMatcher(m_unexpected)(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Not: (" << m_unexpected << ")";
        return strm.str();
    }